

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::rc::TextureCube::sample4(TextureCube *this,Vec4 *output,Vec3 *packetTexcoords,float lodBias)

{
  Vec3 *coords_00;
  Vec4 *pVVar1;
  float fVar2;
  int i;
  CubeFace face;
  long lVar3;
  float *pfVar4;
  int fragNdx;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vec2 coords [4];
  Vec2 dFdy1;
  Vec2 dFdy0;
  Vec2 dFdx1;
  Vec2 dFdx0;
  tcu local_a8 [8];
  tcu local_a0 [8];
  tcu local_98 [8];
  tcu local_90 [16];
  float local_80 [8];
  Vec3 *local_60;
  Vec3 *local_58;
  Sampler *local_50;
  Vec4 *local_48;
  int local_40;
  undefined4 uStack_3c;
  ConstPixelBufferAccess *pCStack_38;
  
  if ((this->m_view).m_numLevels < 1) {
    fVar7 = 0.0;
  }
  else {
    fVar7 = (float)((this->m_view).m_levels[0]->m_size).m_data[0];
  }
  local_50 = (Sampler *)&this->m_view;
  local_58 = packetTexcoords + 1;
  local_60 = packetTexcoords + 2;
  uVar5 = 0;
  local_48 = output;
  do {
    coords_00 = packetTexcoords + uVar5;
    face = tcu::selectCubeFace(coords_00);
    tcu::projectToFace(local_a8,face,packetTexcoords);
    tcu::projectToFace(local_a0,face,local_58);
    tcu::projectToFace(local_98,face,local_60);
    tcu::projectToFace(local_90,face,packetTexcoords + 3);
    local_80[6] = 0.0;
    local_80[7] = 0.0;
    lVar3 = 0;
    do {
      local_80[lVar3 + 6] = *(float *)(local_a0 + lVar3 * 4) - *(float *)(local_a8 + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    local_80[4] = 0.0;
    local_80[5] = 0.0;
    lVar3 = 0;
    do {
      local_80[lVar3 + 4] = *(float *)(local_90 + lVar3 * 4) - *(float *)(local_98 + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    local_80[2] = 0.0;
    local_80[3] = 0.0;
    lVar3 = 0;
    do {
      local_80[lVar3 + 2] = *(float *)(local_98 + lVar3 * 4) - *(float *)(local_a8 + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    local_80[0] = 0.0;
    local_80[1] = 0.0;
    lVar3 = 0;
    do {
      local_80[lVar3] = *(float *)(local_90 + lVar3 * 4) - *(float *)(local_a0 + lVar3 * 4);
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    pfVar4 = local_80 + 4;
    if (uVar5 < 2) {
      pfVar4 = local_80 + 6;
    }
    fVar10 = *pfVar4;
    fVar9 = pfVar4[1];
    fVar8 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar8 = fVar10;
    }
    pfVar4 = local_80;
    if ((uVar5 & 1) == 0) {
      pfVar4 = local_80 + 2;
    }
    fVar10 = *pfVar4;
    fVar2 = pfVar4[1];
    fVar11 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar11 = fVar10;
    }
    fVar10 = -fVar9;
    if (-fVar9 <= fVar9) {
      fVar10 = fVar9;
    }
    fVar9 = -fVar2;
    if (-fVar2 <= fVar2) {
      fVar9 = fVar2;
    }
    fVar8 = (float)(~-(uint)(fVar11 <= fVar8) & (uint)fVar11 |
                   (uint)fVar8 & -(uint)(fVar11 <= fVar8)) * fVar7;
    fVar10 = (float)(~-(uint)(fVar9 <= fVar10) & (uint)fVar9 |
                    (uint)fVar10 & -(uint)(fVar9 <= fVar10)) * fVar7;
    uVar6 = -(uint)(fVar10 <= fVar8);
    fVar10 = logf((float)(~uVar6 & (uint)fVar10 | (uint)fVar8 & uVar6));
    tcu::TextureCubeView::sample
              ((TextureCubeView *)&stack0xffffffffffffffc0,local_50,coords_00->m_data[0],
               coords_00->m_data[1],coords_00->m_data[2],fVar10 * 1.442695 + lodBias);
    pVVar1 = local_48 + uVar5;
    pVVar1->m_data[0] = (float)local_40;
    pVVar1->m_data[1] = (float)uStack_3c;
    *(ConstPixelBufferAccess **)(pVVar1->m_data + 2) = pCStack_38;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  return;
}

Assistant:

void TextureCube::sample4 (tcu::Vec4 output[4], const tcu::Vec3 packetTexcoords[4], float lodBias) const
{
	const float cubeSide = (float)m_view.getSize();

	// Each tex coord might be in a different face.

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::CubeFace face		= tcu::selectCubeFace(packetTexcoords[fragNdx]);
		const tcu::Vec2		coords[4]	=
		{
			tcu::projectToFace(face, packetTexcoords[0]),
			tcu::projectToFace(face, packetTexcoords[1]),
			tcu::projectToFace(face, packetTexcoords[2]),
			tcu::projectToFace(face, packetTexcoords[3]),
		};

		const tcu::Vec2 dFdx0 = coords[1] - coords[0];
		const tcu::Vec2 dFdx1 = coords[3] - coords[2];
		const tcu::Vec2 dFdy0 = coords[2] - coords[0];
		const tcu::Vec2 dFdy1 = coords[3] - coords[1];

		const tcu::Vec2& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec2& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * cubeSide, mv * cubeSide);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), lod);
	}
}